

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O1

int * mbedtls_cipher_list(void)

{
  mbedtls_cipher_definition_t *pmVar1;
  int *piVar2;
  mbedtls_cipher_type_t mVar3;
  
  if (supported_init == '\0') {
    mVar3 = MBEDTLS_CIPHER_AES_128_ECB;
    pmVar1 = mbedtls_cipher_definitions;
    piVar2 = mbedtls_cipher_supported;
    do {
      pmVar1 = pmVar1 + 1;
      *piVar2 = mVar3;
      piVar2 = (int *)((mbedtls_cipher_type_t *)piVar2 + 1);
      mVar3 = pmVar1->type;
    } while (mVar3 != MBEDTLS_CIPHER_NONE);
    *piVar2 = MBEDTLS_CIPHER_NONE;
    supported_init = '\x01';
  }
  return mbedtls_cipher_supported;
}

Assistant:

const int *mbedtls_cipher_list(void)
{
    const mbedtls_cipher_definition_t *def;
    int *type;

    if (!supported_init) {
        def = mbedtls_cipher_definitions;
        type = mbedtls_cipher_supported;

        while (def->type != 0) {
            *type++ = (*def++).type;
        }

        *type = 0;

        supported_init = 1;
    }

    return mbedtls_cipher_supported;
}